

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_json.c
# Opt level: O2

char * parse_string(cJSON *item,char *str)

{
  byte bVar1;
  char *pcVar2;
  undefined8 in_RAX;
  byte *pbVar3;
  byte *pbVar4;
  uint uVar5;
  long lVar6;
  size_t sVar7;
  byte *pbVar8;
  byte *pbVar9;
  undefined8 local_38;
  uint uc2;
  uint uc;
  
  pcVar2 = str;
  if (*str == '\"') {
    sVar7 = 1;
    pbVar8 = (byte *)(str + 1);
    for (pbVar3 = pbVar8; (bVar1 = *pbVar3, bVar1 != 0 && (bVar1 != 0x22));
        pbVar3 = pbVar3 + (ulong)(bVar1 == 0x5c) + 1) {
      sVar7 = sVar7 + 1;
    }
    local_38 = in_RAX;
    pbVar4 = (byte *)(*cJSON_malloc)(sVar7);
    pbVar3 = pbVar4;
    pcVar2 = ep;
    if (pbVar4 != (byte *)0x0) {
      do {
        bVar1 = *pbVar8;
        if (bVar1 == 0x5c) {
          bVar1 = pbVar8[1];
          switch(bVar1) {
          case 0x6e:
            *pbVar3 = 10;
            break;
          case 0x6f:
          case 0x70:
          case 0x71:
          case 0x73:
switchD_00178c0d_caseD_6f:
            *pbVar3 = bVar1;
            break;
          case 0x72:
            *pbVar3 = 0xd;
            break;
          case 0x74:
            *pbVar3 = 9;
            break;
          case 0x75:
            __isoc99_sscanf(pbVar8 + 2,"%4x",(long)&local_38 + 4);
            pbVar9 = pbVar8 + 5;
            if (local_38._4_4_ != 0 && (local_38._4_4_ & 0xfffffc00) != 0xdc00) {
              if ((local_38._4_4_ & 0xfffffc00) == 0xd800) {
                if ((pbVar8[6] == 0x5c) && (pbVar8[7] == 0x75)) {
                  __isoc99_sscanf(pbVar8 + 8,"%4x",&local_38);
                  pbVar9 = pbVar8 + 0xb;
                  if (0xfffffbff < (uint)local_38 - 0xe000) {
                    uVar5 = (local_38._4_4_ & 0x3ff) * 0x400 + ((uint)local_38 & 0x3ff) + 0x10000;
                    local_38 = CONCAT44(uVar5,(uint)local_38);
LAB_00178d1a:
                    pbVar3[3] = (byte)uVar5 & 0x3f | 0x80;
                    uVar5 = local_38._4_4_ >> 6;
                    local_38 = CONCAT44(uVar5,(uint)local_38);
                    lVar6 = 4;
LAB_00178d30:
                    pbVar3[2] = (byte)uVar5 & 0x3f | 0x80;
                    uVar5 = local_38._4_4_ >> 6;
                    local_38 = CONCAT44(uVar5,(uint)local_38);
                    goto LAB_00178d43;
                  }
                }
              }
              else {
                if (local_38._4_4_ < 0x80) {
                  lVar6 = 1;
                  uVar5 = local_38._4_4_;
                }
                else {
                  if (0x7ff < local_38._4_4_) {
                    lVar6 = 3;
                    uVar5 = local_38._4_4_;
                    if (0xffff < local_38._4_4_) goto LAB_00178d1a;
                    goto LAB_00178d30;
                  }
                  lVar6 = 2;
                  uVar5 = local_38._4_4_;
LAB_00178d43:
                  pbVar3[1] = (byte)uVar5 & 0x3f | 0x80;
                  uVar5 = local_38._4_4_ >> 6;
                  local_38 = CONCAT44(uVar5,(uint)local_38);
                }
                *pbVar3 = (byte)uVar5 | ""[lVar6];
                pbVar3 = pbVar3 + lVar6;
              }
            }
            goto LAB_00178cea;
          default:
            if (bVar1 == 0x66) {
              *pbVar3 = 0xc;
            }
            else {
              if (bVar1 != 0x62) goto switchD_00178c0d_caseD_6f;
              *pbVar3 = 8;
            }
          }
          pbVar3 = pbVar3 + 1;
          pbVar9 = pbVar8 + 1;
        }
        else {
          if ((bVar1 == 0) || (bVar1 == 0x22)) {
            *pbVar3 = 0;
            bVar1 = *pbVar8;
            item->valuestring = (char *)pbVar4;
            item->type = 4;
            return (char *)(pbVar8 + (bVar1 == 0x22));
          }
          *pbVar3 = bVar1;
          pbVar3 = pbVar3 + 1;
          pbVar9 = pbVar8;
        }
LAB_00178cea:
        pbVar8 = pbVar9 + 1;
      } while( true );
    }
  }
  ep = pcVar2;
  return (char *)0x0;
}

Assistant:

static const char *parse_string(cJSON *item,const char *str)
{
	const char *ptr=str+1;char *ptr2;char *out;int len=0;unsigned uc,uc2;
	if (*str!='\"') {ep=str;return 0;}	/* not a string! */
	
	while (*ptr!='\"' && *ptr && ++len) if (*ptr++ == '\\') ptr++;	/* Skip escaped quotes. */
	
	out=(char*)cJSON_malloc(len+1);	/* This is how long we need for the string, roughly. */
	if (!out) return 0;
	
	ptr=str+1;ptr2=out;
	while (*ptr!='\"' && *ptr)
	{
		if (*ptr!='\\') *ptr2++=*ptr++;
		else
		{
			ptr++;
			switch (*ptr)
			{
				case 'b': *ptr2++='\b';	break;
				case 'f': *ptr2++='\f';	break;
				case 'n': *ptr2++='\n';	break;
				case 'r': *ptr2++='\r';	break;
				case 't': *ptr2++='\t';	break;
				case 'u':	 /* transcode utf16 to utf8. */
					sscanf(ptr+1,"%4x",&uc);ptr+=4;	/* get the unicode char. */

					if ((uc>=0xDC00 && uc<=0xDFFF) || uc==0)	break;	/* check for invalid.	*/

					if (uc>=0xD800 && uc<=0xDBFF)	/* UTF16 surrogate pairs.	*/
					{
						if (ptr[1]!='\\' || ptr[2]!='u')	break;	/* missing second-half of surrogate.	*/
						sscanf(ptr+3,"%4x",&uc2);ptr+=6;
						if (uc2<0xDC00 || uc2>0xDFFF)		break;	/* invalid second-half of surrogate.	*/
						uc=0x10000 + (((uc&0x3FF)<<10) | (uc2&0x3FF));
					}

					len=4;if (uc<0x80) len=1;else if (uc<0x800) len=2;else if (uc<0x10000) len=3; ptr2+=len;
					
					switch (len) {
						case 4: *--ptr2 =((uc | 0x80) & 0xBF); uc >>= 6;
						case 3: *--ptr2 =((uc | 0x80) & 0xBF); uc >>= 6;
						case 2: *--ptr2 =((uc | 0x80) & 0xBF); uc >>= 6;
						case 1: *--ptr2 =(uc | firstByteMark[len]);
					}
					ptr2+=len;
					break;
				default:  *ptr2++=*ptr; break;
			}
			ptr++;
		}
	}
	*ptr2=0;
	if (*ptr=='\"') ptr++;
	item->valuestring=out;
	item->type=cJSON_String;
	return ptr;
}